

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

void __thiscall soul::heart::Connection::Connection(Connection *this,CodeLocation *l)

{
  SourceCodeText *pSVar1;
  char *pcVar2;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Object_002cf7e8;
  pSVar1 = (l->sourceCode).object;
  pcVar2 = (l->location).data;
  (l->sourceCode).object = (SourceCodeText *)0x0;
  (this->super_Object).location.sourceCode.object = pSVar1;
  (this->super_Object).location.location.data = pcVar2;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)0x0);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Connection_002d0758;
  (this->source).processor.object = (ProcessorInstance *)0x0;
  (this->source).endpointName._M_dataplus._M_p = (pointer)&(this->source).endpointName.field_2;
  (this->source).endpointName._M_string_length = 0;
  (this->source).endpointName.field_2._M_local_buf[0] = '\0';
  (this->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = false;
  (this->dest).processor.object = (ProcessorInstance *)0x0;
  (this->dest).endpointName._M_dataplus._M_p = (pointer)&(this->dest).endpointName.field_2;
  (this->dest).endpointName._M_string_length = 0;
  (this->dest).endpointName.field_2._M_local_buf[0] = '\0';
  (this->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = false;
  this->interpolationType = none;
  (this->delayLength).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  return;
}

Assistant:

Connection (CodeLocation l) : Object (std::move (l)) {}